

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O2

void __thiscall CompileCommandParser::Next(CompileCommandParser *this)

{
  char cVar1;
  allocator local_31;
  string local_30;
  
  cVar1 = std::istream::get();
  this->C = cVar1;
  if (((byte)this->Input[*(long *)(*(long *)this->Input + -0x18) + 0x20] & 1) != 0) {
    std::__cxx11::string::string((string *)&local_30,"Unexpected end of file.",&local_31);
    ErrorExit(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void Next()
  {
    this->C = char(Input->get());
    if (this->Input->bad()) ErrorExit("Unexpected end of file.");
  }